

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_next.c
# Opt level: O2

int NeXTDecode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  long c;
  byte bVar4;
  uint8_t *puVar5;
  tmsize_t tVar6;
  uint32_t *puVar7;
  uint uVar8;
  ulong c_00;
  char *fmt;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  byte *pbVar12;
  long lVar13;
  byte *pbVar14;
  byte *s_00;
  bool bVar15;
  
  puVar5 = buf;
  for (tVar6 = occ; 0 < tVar6; tVar6 = tVar6 + -1) {
    *puVar5 = 0xff;
    puVar5 = puVar5 + 1;
  }
  c = tif->tif_scanlinesize;
  if (occ % c == 0) {
    pbVar14 = tif->tif_rawcp;
    uVar9 = tif->tif_rawcc;
    for (; (0 < (long)uVar9 && (0 < occ)); occ = occ - c) {
      s_00 = pbVar14 + 1;
      bVar2 = *pbVar14;
      uVar10 = uVar9 - 1;
      if (bVar2 == 0x40) {
        if (uVar9 < 5) {
LAB_0026608f:
          uVar3 = tif->tif_row;
          fmt = "Not enough data for scanline %u";
LAB_002660c3:
          TIFFErrorExtR(tif,"NeXTDecode",fmt,(ulong)uVar3);
          return 0;
        }
        c_00 = (ulong)(ushort)(*(ushort *)(pbVar14 + 3) << 8 | *(ushort *)(pbVar14 + 3) >> 8);
        uVar1 = c_00 + 4;
        if ((uVar9 <= uVar1) ||
           (uVar9 = (ulong)(ushort)(*(ushort *)(pbVar14 + 1) << 8 | *(ushort *)(pbVar14 + 1) >> 8),
           c < (long)(c_00 + uVar9))) goto LAB_0026608f;
        _TIFFmemcpy(buf + uVar9,pbVar14 + 5,c_00);
        pbVar14 = s_00 + uVar1;
        uVar9 = uVar10 - uVar1;
      }
      else if (bVar2 == 0) {
        if ((long)uVar9 <= c) goto LAB_0026608f;
        _TIFFmemcpy(buf,s_00,c);
        uVar9 = uVar10 - c;
        pbVar14 = s_00 + c;
      }
      else {
        puVar7 = &(tif->tif_dir).td_tilewidth;
        if ((tif->tif_flags & 0x400) == 0) {
          puVar7 = &(tif->tif_dir).td_imagewidth;
        }
        uVar3 = *puVar7;
        uVar8 = 0;
        lVar13 = 0;
        pbVar12 = buf;
        while( true ) {
          bVar4 = bVar2 >> 6;
          uVar9 = (ulong)(bVar2 & 0x3f);
          while (((0 < (long)uVar9 && (uVar8 < uVar3)) && (lVar13 < c))) {
            switch(uVar8 & 3) {
            case 0:
              *pbVar12 = bVar2 & 0xc0;
              break;
            case 1:
              *pbVar12 = *pbVar12 | bVar4 << 4;
              break;
            case 2:
              *pbVar12 = *pbVar12 | bVar4 * '\x04';
              break;
            case 3:
              *pbVar12 = *pbVar12 | bVar4;
              pbVar12 = pbVar12 + 1;
              lVar13 = lVar13 + 1;
            }
            uVar9 = uVar9 - 1;
            uVar8 = uVar8 + 1;
          }
          uVar9 = uVar10;
          pbVar14 = s_00;
          if (uVar3 <= uVar8) break;
          if (c <= lVar13) {
            uVar3 = tif->tif_row;
            fmt = "Invalid data for scanline %u";
            goto LAB_002660c3;
          }
          bVar15 = uVar10 == 0;
          uVar10 = uVar10 - 1;
          if (bVar15) goto LAB_0026608f;
          bVar2 = *s_00;
          s_00 = s_00 + 1;
        }
      }
      buf = buf + c;
    }
    tif->tif_rawcp = pbVar14;
    tif->tif_rawcc = uVar9;
    iVar11 = 1;
  }
  else {
    iVar11 = 0;
    TIFFErrorExtR(tif,"NeXTDecode","Fractional scanlines cannot be read");
  }
  return iVar11;
}

Assistant:

static int NeXTDecode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "NeXTDecode";
    unsigned char *bp, *op;
    tmsize_t cc;
    uint8_t *row;
    tmsize_t scanline, n;

    (void)s;
    /*
     * Each scanline is assumed to start off as all
     * white (we assume a PhotometricInterpretation
     * of ``min-is-black'').
     */
    for (op = (unsigned char *)buf, cc = occ; cc-- > 0;)
        *op++ = 0xff;

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    scanline = tif->tif_scanlinesize;
    if (occ % scanline)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    for (row = buf; cc > 0 && occ > 0; occ -= scanline, row += scanline)
    {
        n = *bp++;
        cc--;
        switch (n)
        {
            case LITERALROW:
                /*
                 * The entire scanline is given as literal values.
                 */
                if (cc < scanline)
                    goto bad;
                _TIFFmemcpy(row, bp, scanline);
                bp += scanline;
                cc -= scanline;
                break;
            case LITERALSPAN:
            {
                tmsize_t off;
                /*
                 * The scanline has a literal span that begins at some
                 * offset.
                 */
                if (cc < 4)
                    goto bad;
                off = (bp[0] * 256) + bp[1];
                n = (bp[2] * 256) + bp[3];
                if (cc < 4 + n || off + n > scanline)
                    goto bad;
                _TIFFmemcpy(row + off, bp + 4, n);
                bp += 4 + n;
                cc -= 4 + n;
                break;
            }
            default:
            {
                uint32_t npixels = 0, grey;
                tmsize_t op_offset = 0;
                uint32_t imagewidth = tif->tif_dir.td_imagewidth;
                if (isTiled(tif))
                    imagewidth = tif->tif_dir.td_tilewidth;

                /*
                 * The scanline is composed of a sequence of constant
                 * color ``runs''.  We shift into ``run mode'' and
                 * interpret bytes as codes of the form
                 * <color><npixels> until we've filled the scanline.
                 */
                op = row;
                for (;;)
                {
                    grey = (uint32_t)((n >> 6) & 0x3);
                    n &= 0x3f;
                    /*
                     * Ensure the run does not exceed the scanline
                     * bounds, potentially resulting in a security
                     * issue.
                     */
                    while (n-- > 0 && npixels < imagewidth &&
                           op_offset < scanline)
                        SETPIXEL(op, grey);
                    if (npixels >= imagewidth)
                        break;
                    if (op_offset >= scanline)
                    {
                        TIFFErrorExtR(tif, module,
                                      "Invalid data for scanline %" PRIu32,
                                      tif->tif_row);
                        return (0);
                    }
                    if (cc == 0)
                        goto bad;
                    n = *bp++;
                    cc--;
                }
                break;
            }
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
bad:
    TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                  tif->tif_row);
    return (0);
}